

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSession.cpp
# Opt level: O1

ResposeMessage * __thiscall tiger::trains::network::TCPSession::login(TCPSession *this)

{
  char *pcVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  ssize_t sVar6;
  ResposeMessage *pRVar7;
  socklen_t in_ECX;
  char *__n;
  size_t __n_00;
  void *__buf;
  int __fd;
  undefined8 uStack_140;
  char local_138 [4];
  int iStack_134;
  char buffer [255];
  
  __n = local_138;
  uStack_140 = 0x156f0c;
  iVar3 = TCPClient::connect(&this->tcpClient,(int)this->servAddr,
                             (sockaddr *)(ulong)(uint)this->port,in_ECX);
  if ((char)iVar3 == '\0') {
    pRVar7 = (ResposeMessage *)0x0;
  }
  else {
    iVar3 = this->playersNum;
    pRVar7 = (ResposeMessage *)0x0;
    uStack_140 = 0x156f38;
    iVar4 = sprintf(local_138,"{\"name\": \"%s\", \"game\": \"%s\", \"num_players\": %d}",this->name
                    ,this->gameName);
    __n_00 = (size_t)iVar4;
    uVar5 = __n_00 + 0x17 & 0xfffffffffffffff0;
    lVar2 = -uVar5;
    __fd = (int)local_138 + (int)lVar2;
    pcVar1 = local_138 + -uVar5;
    unique0x1000035a = local_138;
    pcVar1[0] = '\x01';
    pcVar1[1] = '\0';
    pcVar1[2] = '\0';
    pcVar1[3] = '\0';
    *(int *)(buffer + lVar2 + -4) = iVar4;
    *(undefined8 *)((long)&uStack_140 + lVar2) = 0x156f77;
    memcpy(buffer + lVar2,local_138,__n_00);
    *(undefined8 *)((long)&uStack_140 + lVar2) = 0x156f85;
    sVar6 = TCPClient::send(&this->tcpClient,__fd,(void *)(__n_00 + 8),(size_t)__n,iVar3);
    if ((int)sVar6 != -1) {
      *(undefined8 *)((long)&uStack_140 + lVar2) = 0x156f92;
      pRVar7 = (ResposeMessage *)recv(this,__fd,__buf,(size_t)__n,iVar3);
    }
  }
  return pRVar7;
}

Assistant:

ResposeMessage *TCPSession::login()
{

    if (!tcpClient.connect(servAddr, port))
    {
        return nullptr;
    }

    char buffer[255];

    size_t len;

    len = sprintf(buffer, "{\"name\": \"%s\", \"game\": \"%s\", \"num_players\": %d}",
                  name, gameName, playersNum);

    char sendBuffer[8+len];

    uint32_t cmd = 1;

    memcpy(sendBuffer, &cmd, 4);
    memcpy(sendBuffer + 4, &len, 4);
    memcpy(sendBuffer + 8, buffer, len);

    int retVal = send(sendBuffer, len + 8);

    if (!retVal)
        return nullptr;

    return recv();



}